

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.hpp
# Opt level: O1

void __thiscall
Diligent::TextureBase<Diligent::EngineGLImplTraits>::CreateDefaultViews
          (TextureBase<Diligent::EngineGLImplTraits> *this)

{
  int iVar1;
  BIND_FLAGS BVar2;
  IMemoryAllocator *pIVar3;
  undefined4 extraout_var;
  uint uVar4;
  char (*Args_1) [27];
  void **ppvVar5;
  Uint8 ViewIdx;
  Uint32 NumDefaultViews;
  anon_class_40_5_9f9a65d9 CreateDefaultView;
  string msg_1;
  TextureViewImplType **ppDefaultViews;
  byte local_6d;
  uint local_6c;
  undefined1 local_68 [32];
  TextureViewImplType ***local_48;
  string local_40;
  void **local_20;
  
  if (this->m_pDefaultViews != (void *)0x0) {
    FormatString<char[44]>
              ((string *)local_68,(char (*) [44])"Default views have already been initialized");
    DebugAssertionFailed
              ((Char *)local_68._0_8_,"CreateDefaultViews",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
               ,0xb8);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
  }
  if ((this->
      super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
      ).m_Desc.Format != TEX_FORMAT_UNKNOWN) {
    BVar2 = (this->
            super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
            ).m_Desc.BindFlags;
    uVar4 = (BVar2 & (BIND_FLAG_LAST|BIND_UNORDERED_ACCESS|BIND_DEPTH_STENCIL|BIND_RENDER_TARGET|
                     BIND_SHADER_RESOURCE)) - (BVar2 >> 1 & 0x454);
    uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333330);
    local_6c = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f) * 0x1010101 >> 0x18;
    if (local_6c != 0) {
      ppvVar5 = &this->m_pDefaultViews;
      if (local_6c != 1) {
        pIVar3 = GetRawAllocator();
        iVar1 = (**pIVar3->_vptr_IMemoryAllocator)
                          (pIVar3,(ulong)local_6c << 3,"Default texture view array",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
                           ,0xc6);
        *ppvVar5 = (void *)CONCAT44(extraout_var,iVar1);
        memset((void *)CONCAT44(extraout_var,iVar1),0,(ulong)local_6c << 3);
      }
      BVar2 = (this->
              super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
              ).m_Desc.BindFlags &
              (BIND_FLAG_LAST|BIND_UNORDERED_ACCESS|BIND_DEPTH_STENCIL|BIND_RENDER_TARGET|
              BIND_SHADER_RESOURCE);
      if ((BVar2 & BVar2 - BIND_VERTEX_BUFFER) != BIND_NONE) {
        ppvVar5 = (void **)this->m_pDefaultViews;
      }
      local_20 = ppvVar5;
      local_68._0_8_ =
           GetTextureFormatAttribs
                     ((this->
                      super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                      ).m_Desc.Format);
      Args_1 = (char (*) [27])&local_6d;
      local_6d = 0;
      local_68._24_8_ = &local_6c;
      local_68._8_8_ = this;
      local_68._16_8_ = Args_1;
      local_48 = (TextureViewImplType ***)&local_20;
      if (((this->
           super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
           ).m_Desc.BindFlags & BIND_SHADER_RESOURCE) != BIND_NONE) {
        CreateDefaultViews::anon_class_40_5_9f9a65d9::operator()
                  ((anon_class_40_5_9f9a65d9 *)local_68,TEXTURE_VIEW_SHADER_RESOURCE);
      }
      if (((this->
           super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
           ).m_Desc.BindFlags & BIND_RENDER_TARGET) != BIND_NONE) {
        CreateDefaultViews::anon_class_40_5_9f9a65d9::operator()
                  ((anon_class_40_5_9f9a65d9 *)local_68,TEXTURE_VIEW_RENDER_TARGET);
      }
      if (((this->
           super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
           ).m_Desc.BindFlags & BIND_DEPTH_STENCIL) != BIND_NONE) {
        CreateDefaultViews::anon_class_40_5_9f9a65d9::operator()
                  ((anon_class_40_5_9f9a65d9 *)local_68,TEXTURE_VIEW_DEPTH_STENCIL);
      }
      if (((this->
           super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
           ).m_Desc.BindFlags & BIND_UNORDERED_ACCESS) != BIND_NONE) {
        CreateDefaultViews::anon_class_40_5_9f9a65d9::operator()
                  ((anon_class_40_5_9f9a65d9 *)local_68,TEXTURE_VIEW_UNORDERED_ACCESS);
      }
      if (((this->
           super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
           ).m_Desc.BindFlags & BIND_FLAG_LAST) != BIND_NONE) {
        CreateDefaultViews::anon_class_40_5_9f9a65d9::operator()
                  ((anon_class_40_5_9f9a65d9 *)local_68,TEXTURE_VIEW_SHADING_RATE);
      }
      if (local_6c != local_6d) {
        FormatString<char[26],char[27]>
                  (&local_40,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"ViewIdx == NumDefaultViews",Args_1);
        DebugAssertionFailed
                  (local_40._M_dataplus._M_p,"CreateDefaultViews",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
                   ,0x123);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void CreateDefaultViews()
    {
        VERIFY(m_pDefaultViews == nullptr, "Default views have already been initialized");

        if (this->m_Desc.Format == TEX_FORMAT_UNKNOWN)
        {
            // Happens when creating dummy OpenGL textures
            return;
        }

        const Uint32 NumDefaultViews = GetNumDefaultViews();
        if (NumDefaultViews == 0)
            return;

        if (NumDefaultViews > 1)
        {
            m_pDefaultViews = ALLOCATE(GetRawAllocator(), "Default texture view array", TextureViewImplType*, NumDefaultViews);
            memset(m_pDefaultViews, 0, sizeof(TextureViewImplType*) * NumDefaultViews);
        }
        TextureViewImplType** ppDefaultViews = GetDefaultViewsArrayPtr();

        const TextureFormatAttribs& TexFmtAttribs = GetTextureFormatAttribs(this->m_Desc.Format);

        Uint8 ViewIdx = 0;

        auto CreateDefaultView = [&](TEXTURE_VIEW_TYPE ViewType) //
        {
            TextureViewDesc ViewDesc;
            ViewDesc.ViewType = ViewType;

            if (TexFmtAttribs.IsTypeless)
            {
                ViewDesc.Format = GetDefaultTextureViewFormat(this->m_Desc, ViewType);
                if (ViewDesc.Format == TEX_FORMAT_UNKNOWN)
                {
                    return;
                }
            }

            std::string ViewName;
            switch (ViewType)
            {
                case TEXTURE_VIEW_SHADER_RESOURCE:
                    if ((this->m_Desc.MiscFlags & MISC_TEXTURE_FLAG_GENERATE_MIPS) != 0)
                        ViewDesc.Flags |= TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION;
                    ViewName = "Default SRV of texture '";
                    break;

                case TEXTURE_VIEW_RENDER_TARGET:
                    ViewName = "Default RTV of texture '";
                    break;

                case TEXTURE_VIEW_DEPTH_STENCIL:
                    ViewName = "Default DSV of texture '";
                    break;

                case TEXTURE_VIEW_UNORDERED_ACCESS:
                    ViewDesc.AccessFlags = UAV_ACCESS_FLAG_READ_WRITE;

                    ViewName = "Default UAV of texture '";
                    break;

                case TEXTURE_VIEW_SHADING_RATE:
                    ViewDesc.AccessFlags = UAV_ACCESS_FLAG_READ_WRITE;

                    ViewName = "Default VRS view of texture '";
                    break;

                default:
                    UNEXPECTED("Unexpected texture type");
            }
            ViewName += this->m_Desc.Name;
            ViewName += '\'';
            ViewDesc.Name = ViewName.c_str();

            VERIFY_EXPR(ViewIdx < NumDefaultViews);
            TextureViewImplType*& pView = ppDefaultViews[ViewIdx];
            CreateViewInternal(ViewDesc, reinterpret_cast<ITextureView**>(&pView), true);
            DEV_CHECK_ERR(pView != nullptr, "Failed to create default view for texture '", this->m_Desc.Name, "'.");
            DEV_CHECK_ERR(pView->GetDesc().ViewType == ViewType, "Unexpected view type.");

            m_ViewIndices[ViewType] = ViewIdx++;
        };

        if (this->m_Desc.BindFlags & BIND_SHADER_RESOURCE)
        {
            CreateDefaultView(TEXTURE_VIEW_SHADER_RESOURCE);
        }

        if (this->m_Desc.BindFlags & BIND_RENDER_TARGET)
        {
            CreateDefaultView(TEXTURE_VIEW_RENDER_TARGET);
        }

        if (this->m_Desc.BindFlags & BIND_DEPTH_STENCIL)
        {
            CreateDefaultView(TEXTURE_VIEW_DEPTH_STENCIL);
        }

        if (this->m_Desc.BindFlags & BIND_UNORDERED_ACCESS)
        {
            CreateDefaultView(TEXTURE_VIEW_UNORDERED_ACCESS);
        }

        if (this->m_Desc.BindFlags & BIND_SHADING_RATE)
        {
            CreateDefaultView(TEXTURE_VIEW_SHADING_RATE);
        }

        VERIFY_EXPR(ViewIdx == NumDefaultViews);
    }